

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void execute_stored_code(vector<unsigned_char,_std::allocator<unsigned_char>_> *code)

{
  uint uVar1;
  int iVar2;
  code *__dest;
  pointer __src;
  ostream *poVar3;
  int *piVar4;
  char *pcVar5;
  uint *puVar6;
  error_category *peVar7;
  system_error *this;
  size_t __n;
  pointer puVar8;
  error_code __ec;
  error_code __ec_00;
  
  __dest = (code *)mmap((void *)0x0,
                        (long)(code->
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)(code->
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                              _M_impl.super__Vector_impl_data._M_start,2,0x22,-1,0);
  if (__dest == (code *)0xffffffffffffffff) {
    puVar6 = (uint *)__errno_location();
    uVar1 = *puVar6;
    peVar7 = (error_category *)std::_V2::system_category();
    this = (system_error *)__cxa_allocate_exception(0x20);
    __ec._4_4_ = 0;
    __ec._M_value = uVar1;
    __ec._M_cat = peVar7;
    std::system_error::system_error(this,__ec,"Failed to allocate memory for the code");
  }
  else {
    __src = (code->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_start;
    __n = (long)(code->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)__src;
    puVar8 = __src;
    if (__n != 0) {
      memmove(__dest,__src,__n);
      __src = (code->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_finish;
      puVar8 = (code->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
    }
    iVar2 = mprotect(__dest,(long)__src - (long)puVar8,5);
    if (iVar2 == 0) {
      (*__dest)();
      iVar2 = munmap(__dest,(long)(code->
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(code->
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                                  ._M_impl.super__Vector_impl_data._M_start);
      if (iVar2 == 0) {
        return;
      }
      poVar3 = std::operator<<((ostream *)&std::cerr,"Warning: failed to deallocate code memory: ");
      piVar4 = __errno_location();
      pcVar5 = strerror(*piVar4);
      poVar3 = std::operator<<(poVar3,pcVar5);
      std::endl<char,std::char_traits<char>>(poVar3);
      return;
    }
    puVar6 = (uint *)__errno_location();
    uVar1 = *puVar6;
    peVar7 = (error_category *)std::_V2::system_category();
    this = (system_error *)__cxa_allocate_exception(0x20);
    __ec_00._4_4_ = 0;
    __ec_00._M_value = uVar1;
    __ec_00._M_cat = peVar7;
    std::system_error::system_error(this,__ec_00,"Failed to change memory permissions");
  }
  __cxa_throw(this,&std::system_error::typeinfo,std::system_error::~system_error);
}

Assistant:

void execute_stored_code(const std::vector<byte>& code)
{
    // Allocate
    void* memory = mmap(nullptr, code.size(), PROT_WRITE, MAP_PRIVATE | MAP_ANONYMOUS, -1, 0);
    if (memory == MAP_FAILED) {
        std::error_code ec(errno, std::system_category());
        throw std::system_error(ec, "Failed to allocate memory for the code");
    }

    // Copy
    std::copy(code.cbegin(), code.cend(), static_cast<byte*>(memory));

    // Protect (r-x)
    if (mprotect(memory, code.size(), PROT_READ | PROT_EXEC) != 0) {
        std::error_code ec(errno, std::system_category());
        throw std::system_error(ec, "Failed to change memory permissions");
    }

    // Execute
    (reinterpret_cast<void(*)(void)>(memory))();

    // Deallocate
    if (munmap(memory, code.size()) != 0) {
        std::cerr << "Warning: failed to deallocate code memory: "
                  << strerror(errno) << std::endl;
    }
}